

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

bool __thiscall pg::DTLSolver::sptl(DTLSolver *this,bitset *V,bitset *W,bitset *R,int player)

{
  ulong *puVar1;
  uint uVar2;
  int *piVar3;
  Game *pGVar4;
  size_t sVar5;
  byte bVar6;
  char cVar7;
  bool bVar8;
  ostream *poVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  bitset *Z;
  ulong uVar14;
  bool bVar15;
  _label_vertex local_60;
  bitset *local_50;
  bitset *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar8 = false;
  uVar10 = (int)((this->super_Solver).game)->n_vertices - 1;
  if (-1 < (int)uVar10) {
    Z = &this->Z;
    bVar8 = false;
    uVar14 = (ulong)uVar10;
    local_50 = Z;
    local_48 = W;
    do {
      local_38 = uVar14 >> 6;
      if (((V->_bits[local_38] >> (uVar14 & 0x3f) & 1) != 0) &&
         (local_40 = 1L << (uVar14 & 0x3f), (R->_bits[local_38] & local_40) != 0)) {
        puVar1 = (this->Z)._bits + local_38;
        *puVar1 = *puVar1 | local_40;
        this->str[uVar14] = -1;
        iVar13 = (this->Q).pointer;
        (this->Q).pointer = iVar13 + 1;
        (this->Q).queue[iVar13] = (uint)uVar14;
        iVar13 = (this->Q).pointer;
        while (iVar13 != 0) {
          (this->Q).pointer = iVar13 + -1;
          uVar2 = (this->Q).queue[(long)iVar13 + -1];
          uVar11 = (ulong)(int)uVar2;
          bVar6 = (byte)uVar2 & 0x3f;
          R->_bits[uVar11 >> 6] =
               R->_bits[uVar11 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
          if (1 < (this->super_Solver).trace) {
            iVar13 = (this->Zvec).pointer;
            (this->Zvec).pointer = iVar13 + 1;
            (this->Zvec).queue[iVar13] = uVar2;
          }
          attractVertices(this,player,uVar2,R,Z,R,((this->super_Solver).game)->_priority[uVar14]);
          piVar12 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar3 = this->tin[uVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar12 != piVar3) {
            iVar13 = ((this->super_Solver).game)->_priority[uVar14];
            do {
              attractTangle(this,*piVar12,player,R,Z,R,iVar13);
              piVar12 = piVar12 + 1;
            } while (piVar12 != piVar3);
          }
          iVar13 = (this->Q).pointer;
        }
        if (1 < (this->super_Solver).trace) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
          poVar9 = (ostream *)
                   std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[uVar14]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
          if ((this->Zvec).pointer != 0) {
            uVar11 = 0;
            do {
              poVar9 = (this->super_Solver).logger;
              uVar2 = (this->Zvec).queue[uVar11];
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," \x1b[1;38;5;15m",0xd);
              local_60.g = (this->super_Solver).game;
              local_60.v = uVar2;
              poVar9 = operator<<(poVar9,&local_60);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
              if (this->str[(int)uVar2] != -1) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"->",2);
                local_60.g = (this->super_Solver).game;
                local_60.v = this->str[(int)uVar2];
                operator<<(poVar9,&local_60);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 < (uint)(this->Zvec).pointer);
          }
          poVar9 = (this->super_Solver).logger;
          cVar7 = (char)poVar9;
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
          (this->Zvec).pointer = 0;
          Z = local_50;
        }
        pGVar4 = (this->super_Solver).game;
        if ((uint)(((pGVar4->_owner)._bits[local_38] >> (uVar14 & 0x3f) & 1) != 0) == player) {
          bVar15 = this->str[uVar14] != -1;
LAB_001757c4:
          if (bVar15) goto LAB_001757c9;
        }
        else {
          iVar13 = pGVar4->_outedges[pGVar4->_firstouts[uVar14]];
          if (iVar13 != -1) {
            piVar12 = pGVar4->_outedges + (long)pGVar4->_firstouts[uVar14] + 1;
            bVar15 = true;
            do {
              if ((R->_bits[(ulong)(long)iVar13 >> 6] >> ((long)iVar13 & 0x3fU) & 1) != 0) {
                bVar15 = false;
                break;
              }
              iVar13 = *piVar12;
              piVar12 = piVar12 + 1;
            } while (iVar13 != -1);
            goto LAB_001757c4;
          }
LAB_001757c9:
          uVar11 = local_48->_bits[local_38];
          if ((uVar11 & local_40) == 0) {
            local_48->_bits[local_38] = uVar11 | local_40;
            memset(this->pea_vidx,0,pGVar4->n_vertices << 2);
            this->pea_curidx = 1;
            bVar15 = extractTangles(this,(uint)uVar14,Z,this->str);
            if (bVar15) {
              bVar8 = true;
            }
          }
        }
        sVar5 = (this->Z)._bitssize;
        if (sVar5 != 0) {
          memset(Z->_bits,0,sVar5 << 3);
        }
      }
      bVar15 = 0 < (long)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar15);
  }
  return bVar8;
}

Assistant:

bool
DTLSolver::sptl(bitset &V, bitset &W, bitset &R, const int player)
{
    bool changes = false;

    for (int top=nodecount()-1; top>=0; top--) {
        if (!V[top] or !R[top]) continue; // meh

        Z[top] = true; // add to <Z>
        str[top] = -1;
        Q.push(top);

        while (Q.nonempty()) {
            const int v = Q.pop();
            R[v] = false; // remove from <R>
#ifndef NDEBUG
            if (trace >= 2) Zvec.push(v);
#endif
            attractVertices(player, v, R, Z, R, priority(top));
            attractTangles(player, v, R, Z, R, priority(top));
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m \033[1;36m" << priority(top) << "\033[m";
            for (unsigned int i=0; i<Zvec.size(); i++) {
                int v = Zvec[i];
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
            Zvec.clear();
        }
#endif

        bool closed_region = true;

        if (owner(top) == player) {
            if (str[top] == -1) {
                closed_region = false;
            }
        } else {
            for (auto curedge = outs(top); *curedge != -1; curedge++) {
                int to = *curedge;
                if (R[to]) {
                    closed_region = false;
                    break;
                }
            }
        }

        if (closed_region and !W[top]) {
            W[top] = true;

            /**
             * Extract tangles by computing SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a head vertex.
             */

            memset(pea_vidx, 0, sizeof(int[nodecount()]));
            pea_curidx = 1;

            if (extractTangles(top, Z, str)) changes = true;
        }

        Z.reset();
    }

    return changes;
}